

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

void __thiscall InsertProxyModelPrivate::afterSort(InsertProxyModelPrivate *this,bool isRow)

{
  InsertProxyModel *pIVar1;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar2;
  QMap<int,_QVariant> *pQVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  reference pQVar8;
  long lVar9;
  uint uVar10;
  undefined7 in_register_00000031;
  QModelIndexList toList;
  QList<QMap<int,_QVariant>_> oldlayout;
  undefined4 local_cc;
  QList<QModelIndex> local_c8;
  InsertProxyModelPrivate *local_a8;
  QArrayDataPointer<QMap<int,_QVariant>_> local_a0;
  long local_88;
  QList<QMap<int,_QVariant>_> *local_80;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *local_78;
  quintptr local_70;
  QAbstractItemModel *pQStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pIVar1 = this->q_ptr;
  plVar7 = (long *)QAbstractProxyModel::sourceModel();
  if ((int)CONCAT71(in_register_00000031,isRow) == 0) {
    uVar10 = 1;
    lVar9 = 0x80;
  }
  else {
    uVar10 = 2;
    lVar9 = 0x78;
  }
  local_a0.d = (Data *)0xffffffffffffffff;
  local_a0.ptr = (QMap<int,_QVariant> *)0x0;
  local_a0.size = 0;
  uVar5 = (**(code **)(*plVar7 + lVar9))(plVar7);
  if (((this->m_insertDirection).i & uVar10) != 0) {
    bVar4 = !isRow;
    local_a0.d = this->m_extraData[bVar4].d.d;
    local_a0.ptr = this->m_extraData[bVar4].d.ptr;
    local_a0.size = this->m_extraData[bVar4].d.size;
    if (local_a0.d != (Data *)0x0) {
      LOCK();
      ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (isRow) {
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      local_c8.d.d = (Data *)0xffffffffffffffff;
      local_c8.d.ptr = (QModelIndex *)0x0;
      local_c8.d.size = 0;
      local_cc = (**(code **)(*plVar7 + 0x80))(plVar7);
    }
    else {
      plVar7 = (long *)QAbstractProxyModel::sourceModel();
      local_78 = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                  *)0xffffffffffffffff;
      local_70 = 0;
      pQStack_68 = (QAbstractItemModel *)0x0;
      local_cc = (**(code **)(*plVar7 + 0x78))(plVar7);
    }
    local_c8.d.d = (Data *)0x0;
    local_c8.d.ptr = (QModelIndex *)0x0;
    local_c8.d.size = 0;
    QList<QModelIndex>::reserve(&local_c8,(long)(int)uVar5);
    if (0 < (int)uVar5) {
      local_80 = this->m_extraData + bVar4;
      local_88 = (ulong)uVar5 << 3;
      lVar9 = 0;
      local_a8 = this;
      do {
        if (isRow) {
          iVar6 = QPersistentModelIndex::row();
        }
        else {
          iVar6 = QPersistentModelIndex::column();
        }
        pQVar3 = local_a0.ptr;
        pQVar8 = QList<QMap<int,_QVariant>_>::operator[](local_80,(long)iVar6);
        pQVar2 = *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   **)((long)&(pQVar3->d).d + lVar9);
        if (pQVar2 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                       *)0x0) {
          LOCK();
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
          UNLOCK();
        }
        local_78 = (pQVar8->d).d;
        (pQVar8->d).d = pQVar2;
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2
                  ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    *)&local_78);
        if (isRow) {
          local_48 = 0xffffffffffffffff;
          local_40 = 0;
          uStack_38 = 0;
          (**(code **)(*(long *)pIVar1 + 0x60))
                    ((QModelIndex *)&local_78,pIVar1,iVar6,local_cc,&local_48);
        }
        else {
          local_60 = 0xffffffffffffffff;
          local_58 = 0;
          uStack_50 = 0;
          (**(code **)(*(long *)pIVar1 + 0x60))
                    ((QModelIndex *)&local_78,pIVar1,local_cc,iVar6,&local_60);
        }
        this = local_a8;
        QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                  ((QMovableArrayOps<QModelIndex> *)&local_c8,local_c8.d.size,
                   (QModelIndex *)&local_78);
        lVar9 = lVar9 + 8;
      } while (local_88 != lVar9);
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList *)pIVar1,(QList *)&this->m_layoutChangeExtraProxyIndexes);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,0x18,8);
      }
    }
    QArrayDataPointer<QMap<int,_QVariant>_>::~QArrayDataPointer(&local_a0);
  }
  QList<QModelIndex>::clear(&this->m_layoutChangeExtraProxyIndexes);
  QList<QPersistentModelIndex>::clear(&this->m_layoutChangeExtraPersistentIndexes);
  return;
}

Assistant:

void InsertProxyModelPrivate::afterSort(bool isRow)
{
    Q_Q(InsertProxyModel);
    const int maxSortedIdx = isRow ? q->sourceModel()->rowCount() : q->sourceModel()->columnCount();
    const InsertProxyModel::InsertDirections directionCheck = isRow ? InsertProxyModel::InsertColumn : InsertProxyModel::InsertRow;
    if (m_insertDirection & directionCheck) {
        const auto oldlayout = m_extraData[!isRow];
        const int maxSecondaryIdx = isRow ? q->sourceModel()->columnCount() : q->sourceModel()->rowCount();
        QModelIndexList toList;
        toList.reserve(maxSortedIdx);
        Q_ASSERT(m_layoutChangeExtraPersistentIndexes.size() == maxSortedIdx);
        for (int i = 0; i < maxSortedIdx; ++i) {
            const int newSortedIdx = isRow ? m_layoutChangeExtraPersistentIndexes.at(i).row() : m_layoutChangeExtraPersistentIndexes.at(i).column();
            m_extraData[!isRow][newSortedIdx] = oldlayout.at(i);
            toList << (isRow ? q->index(newSortedIdx, maxSecondaryIdx) : q->index(maxSecondaryIdx, newSortedIdx));
        }
        q->changePersistentIndexList(m_layoutChangeExtraProxyIndexes, toList);
    }
    m_layoutChangeExtraProxyIndexes.clear();
    m_layoutChangeExtraPersistentIndexes.clear();
}